

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread.cpp
# Opt level: O0

void PAL_exit(int status)

{
  int status_local;
  
  if (!PAL_InitializeChakraCoreCalled) {
    abort();
  }
  ExitProcess(status);
}

Assistant:

void
PAL_exit(int status)
{
    PERF_ENTRY(exit);
    ENTRY ("exit(status=%d)\n", status);

    /* should also clean up any resources allocated by pal/cruntime, if any */
    ExitProcess(status);

    LOGEXIT ("exit returns void");
    PERF_EXIT(exit);
}